

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
deqp::gls::generateVertexSpecialization_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,gls *this,ProgramSpecializationParams *specParams)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  DataType DVar6;
  DataType DVar7;
  char *__s;
  size_t sVar8;
  char *__s_00;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ostringstream decl;
  ostringstream setup;
  undefined1 auStack_3a8 [8];
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  long local_378;
  char *local_370;
  gls *local_368;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  long local_320 [14];
  ios_base local_2b0 [264];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_368 = this;
  bVar5 = glu::glslVersionUsesInOutQualifiers(*(GLSLVersion *)(*(long *)this + 8));
  local_370 = "attribute";
  if (bVar5) {
    local_370 = "in";
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_378 = 9;
  if (bVar5) {
    local_378 = 2;
  }
  local_3a0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               *)__return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,local_370,local_378);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320," highp vec4 dEQP_Position;\n",0x1b);
  lVar11 = *(long *)local_368;
  lVar12 = *(long *)(lVar11 + 0x30);
  if (*(long *)(lVar11 + 0x38) != lVar12) {
    lVar10 = 0x20;
    uVar13 = 0;
    do {
      DVar7 = *(DataType *)(lVar12 + -0x18 + lVar10);
      __s = glu::getDataTypeName(DVar7);
      DVar6 = glu::getDataTypeScalarType(DVar7);
      if (DVar6 == TYPE_FLOAT) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,local_370,local_378)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
        if (__s == (char *)0x0) {
          std::ios::clear((int)auStack_3a8 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x88);
        }
        else {
          sVar8 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,__s,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_320,*(char **)(lVar12 + -8 + lVar10),
                            *(long *)(lVar12 + lVar10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
      }
      else {
        DVar7 = glu::getDataTypeFloatScalars(DVar7);
        __s_00 = glu::getDataTypeName(DVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,local_370,local_378)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
        if (__s_00 == (char *)0x0) {
          std::ios::clear((int)auStack_3a8 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x88);
        }
        else {
          sVar8 = strlen(__s_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,__s_00,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," a_",3);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_320,*(char **)(lVar12 + -8 + lVar10),
                            *(long *)(lVar12 + lVar10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
        if (__s == (char *)0x0) {
          std::ios::clear((int)auStack_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x200);
        }
        else {
          sVar8 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)(lVar12 + -8 + lVar10),
                            *(long *)(lVar12 + lVar10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
        }
        else {
          sVar8 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,__s,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(a_",3);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,*(char **)(lVar12 + -8 + lVar10),*(long *)(lVar12 + lVar10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,");\n",3);
      }
      uVar13 = uVar13 + 1;
      lVar11 = *(long *)local_368;
      lVar12 = *(long *)(lVar11 + 0x30);
      lVar10 = lVar10 + 0x50;
    } while (uVar13 < (ulong)((*(long *)(lVar11 + 0x38) - lVar12 >> 4) * -0x3333333333333333));
  }
  generateUniformDeclarations((ostream *)local_320,(ValueBlock *)(lVar11 + 0x30));
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_360,(char (*) [20])"VERTEX_DECLARATIONS",&local_398);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_3a0,&local_360);
  paVar2 = &local_360.second.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.second._M_dataplus._M_p != paVar2) {
    operator_delete(local_360.second._M_dataplus._M_p,
                    local_360.second.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_360.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_360.first._M_dataplus._M_p,
                    local_360.first.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &local_398.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar4) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_360,(char (*) [13])"VERTEX_SETUP",&local_398);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_3a0,&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.second._M_dataplus._M_p != paVar2) {
    operator_delete(local_360.second._M_dataplus._M_p,
                    local_360.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_360.first._M_dataplus._M_p,
                    local_360.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar4) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  local_398._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_398,"gl_Position = dEQP_Position;\n","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_360,(char (*) [14])"VERTEX_OUTPUT",&local_398);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_3a0,&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.second._M_dataplus._M_p != paVar2) {
    operator_delete(local_360.second._M_dataplus._M_p,
                    local_360.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_360.first._M_dataplus._M_p,
                    local_360.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar4) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_3a0;
}

Assistant:

static map<string, string> generateVertexSpecialization (const ProgramSpecializationParams& specParams)
{
	const bool				usesInout	= glslVersionUsesInOutQualifiers(specParams.caseSpec.targetVersion);
	const char*				vtxIn		= usesInout ? "in" : "attribute";
	ostringstream			decl;
	ostringstream			setup;
	map<string, string>		params;

	decl << vtxIn << " highp vec4 dEQP_Position;\n";

	for (size_t ndx = 0; ndx < specParams.caseSpec.values.inputs.size(); ndx++)
	{
		const Value&		val			= specParams.caseSpec.values.inputs[ndx];
		const DataType		basicType	= val.type.getBasicType();
		const char* const	typeStr		= getDataTypeName(val.type.getBasicType());

		if (getDataTypeScalarType(basicType) == TYPE_FLOAT)
		{
			decl << vtxIn << " " << typeStr << " " << val.name << ";\n";
		}
		else
		{
			const DataType		floatType		= getDataTypeFloatScalars(basicType);
			const char* const	floatTypeStr	= getDataTypeName(floatType);

			decl << vtxIn << " " << floatTypeStr << " a_" << val.name << ";\n";
			setup << typeStr << " " << val.name << " = " << typeStr << "(a_" << val.name << ");\n";
		}
	}

	generateUniformDeclarations(decl, specParams.caseSpec.values);

	params.insert(pair<string, string>("VERTEX_DECLARATIONS",	decl.str()));
	params.insert(pair<string, string>("VERTEX_SETUP",			setup.str()));
	params.insert(pair<string, string>("VERTEX_OUTPUT",			string("gl_Position = dEQP_Position;\n")));

	return params;
}